

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

void __thiscall llvm::yaml::Scanner::removeStaleSimpleKeyCandidates(Scanner *this)

{
  long *plVar1;
  long *plVar2;
  long *__dest;
  SmallVector<(anonymous_namespace)::SimpleKey,_4U> *this_00;
  Twine local_50;
  SmallVector<(anonymous_namespace)::SimpleKey,_4U> *local_38;
  
  this_00 = &this->SimpleKeys;
  plVar1 = (long *)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                   super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                   super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                   super_SmallVectorBase.BeginX;
  __dest = plVar1;
  while( true ) {
    plVar2 = __dest;
    while( true ) {
      plVar2 = plVar2 + 3;
      if (__dest == plVar1 + (ulong)(this->SimpleKeys).
                                    super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                                    super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>
                                    .
                                    super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>
                                    .super_SmallVectorBase.Size * 3) {
        return;
      }
      if ((*(uint *)((long)__dest + 0xc) != this->Line) || ((int)__dest[1] + 0x400U < this->Column))
      break;
      __dest = __dest + 3;
    }
    if (*(char *)((long)__dest + 0x14) == '\x01') {
      local_38 = this_00;
      Twine::Twine(&local_50,"Could not find expected : for simple key");
      this_00 = local_38;
      setError(this,&local_50,*(iterator *)(*__dest + 0x18));
      plVar1 = (long *)(this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                       super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                       super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                       super_SmallVectorBase.BeginX;
    }
    if (__dest < plVar1) break;
    plVar1 = plVar1 + (ulong)(this->SimpleKeys).
                             super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
                             super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                             super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>
                             .super_SmallVectorBase.Size * 3;
    if (plVar1 <= __dest) {
      __assert_fail("I < this->end() && \"Erasing at past-the-end iterator.\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                    ,0x1b7,
                    "iterator llvm::SmallVectorImpl<(anonymous namespace)::SimpleKey>::erase(const_iterator) [T = (anonymous namespace)::SimpleKey]"
                   );
    }
    if (__dest + 3 != plVar1) {
      memmove(__dest,__dest + 3,(long)plVar1 - (long)plVar2);
    }
    SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>::pop_back
              ((SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true> *)this_00);
    plVar1 = (long *)(this_00->super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>).
                     super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
                     super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
                     super_SmallVectorBase.BeginX;
  }
  __assert_fail("I >= this->begin() && \"Iterator to erase is out of bounds.\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x1b6,
                "iterator llvm::SmallVectorImpl<(anonymous namespace)::SimpleKey>::erase(const_iterator) [T = (anonymous namespace)::SimpleKey]"
               );
}

Assistant:

void Scanner::removeStaleSimpleKeyCandidates() {
  for (SmallVectorImpl<SimpleKey>::iterator i = SimpleKeys.begin();
                                            i != SimpleKeys.end();) {
    if (i->Line != Line || i->Column + 1024 < Column) {
      if (i->IsRequired)
        setError( "Could not find expected : for simple key"
                , i->Tok->Range.begin());
      i = SimpleKeys.erase(i);
    } else
      ++i;
  }
}